

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O2

void common_ngram_cache_save(common_ngram_cache *ngram_cache,string *filename)

{
  __node_base *p_Var1;
  __node_base *p_Var2;
  int32_t count;
  llama_token token;
  int32_t ntokens;
  common_ngram ngram;
  common_ngram_cache_part token_counts;
  pair<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  item;
  ofstream file_out;
  
  std::ofstream::ofstream(&file_out,(string *)filename,_S_bin);
  p_Var2 = &(ngram_cache->_M_h)._M_before_begin;
  while( true ) {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      std::ofstream::~ofstream(&file_out);
      return;
    }
    std::
    pair<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
    ::
    pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_true>
              (&item,(pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                      *)(p_Var2 + 1));
    ngram.tokens[0] = item.first.tokens[0];
    ngram.tokens[1] = item.first.tokens[1];
    ngram.tokens[2] = item.first.tokens[2];
    ngram.tokens[3] = item.first.tokens[3];
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&token_counts._M_h,&item.second._M_h);
    if (token_counts._M_h._M_element_count == 0) break;
    ntokens = (int32_t)token_counts._M_h._M_element_count;
    if (ntokens < 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                 ,0xcf,"GGML_ASSERT(%s) failed","ntokens > 0");
    }
    std::ostream::write((char *)&file_out,(long)&ngram);
    std::ostream::write((char *)&file_out,(long)&ntokens);
    p_Var1 = &token_counts._M_h._M_before_begin;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      token = (llama_token)*(size_type *)(p_Var1 + 1);
      count = *(int32_t *)((long)(p_Var1 + 1) + 4);
      if (count < 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                   ,0xd6,"GGML_ASSERT(%s) failed","count > 0");
      }
      std::ostream::write((char *)&file_out,(long)&token);
      std::ostream::write((char *)&file_out,(long)&count);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&token_counts._M_h);
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&item.second._M_h);
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
             ,0xcd,"GGML_ASSERT(%s) failed","!token_counts.empty()");
}

Assistant:

void common_ngram_cache_save(common_ngram_cache & ngram_cache, std::string & filename) {
    std::ofstream file_out(filename, std::ios::binary);
    for (std::pair<common_ngram, common_ngram_cache_part> item : ngram_cache) {
        const common_ngram      ngram        = item.first;
        common_ngram_cache_part token_counts = item.second;
        GGML_ASSERT(!token_counts.empty());
        const int32_t ntokens = token_counts.size();
        GGML_ASSERT(ntokens > 0);

        file_out.write(reinterpret_cast<const char *>(&ngram),   sizeof(common_ngram));
        file_out.write(reinterpret_cast<const char *>(&ntokens), sizeof(int32_t));
        for (std::pair<llama_token, int32_t> item2 : token_counts) {
            const llama_token token = item2.first;
            const int32_t     count = item2.second;
            GGML_ASSERT(count > 0);

            file_out.write(reinterpret_cast<const char *>(&token), sizeof(llama_token));
            file_out.write(reinterpret_cast<const char *>(&count), sizeof(int32_t));
        }
    }

}